

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  uint in_EAX;
  int iVar1;
  int a;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  iVar1 = 0;
  while (iVar1 == 0) {
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_6c3);
    std::istream::operator>>((istream *)&std::cin,(int *)((long)&uStack_28 + 4));
    iVar1 = uStack_28._4_4_;
  }
  return 0;
}

Assistant:

int main() {
    int a = 0;

    while(0 == a) {
        cout << "Введите число (оно должно отличаться от 0) ";
        cin >> a;
    }

    return 0;
}